

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InstrumentPass::InstProcessCallTreeFromRoots
          (InstrumentPass *this,InstProcessFunction *pfn,
          queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *roots,
          uint32_t stage_idx)

{
  Function *func;
  byte bVar1;
  bool bVar2;
  uint uVar3;
  reference ppVar4;
  reference pvVar5;
  mapped_type *ppFVar6;
  IRContext *this_00;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar7;
  byte local_f9;
  Function *fn;
  value_type local_c4;
  _Node_iterator_base<unsigned_int,_false> _Stack_c0;
  uint32_t fi;
  undefined1 local_b8;
  reference local_b0;
  pair<const_unsigned_int,_unsigned_int> *ofn;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *__range2_1;
  pair<const_unsigned_int,_unsigned_int> *ifn;
  iterator __end2;
  iterator __begin2;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *__range2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  done;
  bool modified;
  uint32_t stage_idx_local;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *roots_local;
  InstProcessFunction *pfn_local;
  InstrumentPass *this_local;
  
  done._M_h._M_single_bucket._3_1_ = 0;
  done._M_h._M_single_bucket._4_4_ = stage_idx;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&__range2);
  __end2 = std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::begin(&this->param2input_func_id_);
  ifn = (pair<const_unsigned_int,_unsigned_int> *)
        std::
        unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        ::end(&this->param2input_func_id_);
  while (bVar2 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                            ,(_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                              *)&ifn), bVar2) {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator*
                       (&__end2);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&__range2,&ppVar4->second);
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
    operator++(&__end2);
  }
  __end2_1 = std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::begin(&this->param2output_func_id_);
  ofn = (pair<const_unsigned_int,_unsigned_int> *)
        std::
        unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        ::end(&this->param2output_func_id_);
  while (bVar2 = std::__detail::operator!=
                           (&__end2_1.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                            ,(_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                              *)&ofn), bVar2) {
    local_b0 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator*
                         (&__end2_1);
    pVar7 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&__range2,&local_b0->second);
    _Stack_c0._M_cur =
         (__node_type *)pVar7.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    local_b8 = pVar7.second;
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
    operator++(&__end2_1);
  }
  while (bVar2 = std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::empty(roots), bVar1 = done._M_h._M_single_bucket._3_1_,
        ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar5 = std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
             front(roots);
    local_c4 = *pvVar5;
    std::queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::pop(roots);
    pVar7 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&__range2,&local_c4);
    if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      ppFVar6 = std::
                unordered_map<unsigned_int,_spvtools::opt::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>_>
                ::at(&this->id2function_,&local_c4);
      func = *ppFVar6;
      this_00 = Pass::context(&this->super_Pass);
      IRContext::AddCalls(this_00,func,roots);
      uVar3 = (*(this->super_Pass)._vptr_Pass[5])
                        (this,func,(ulong)done._M_h._M_single_bucket._4_4_,pfn);
      local_f9 = 1;
      if ((uVar3 & 1) == 0) {
        local_f9 = done._M_h._M_single_bucket._3_1_;
      }
      done._M_h._M_single_bucket._3_1_ = local_f9 & 1;
    }
  }
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&__range2);
  return (bool)(bVar1 & 1);
}

Assistant:

bool InstrumentPass::InstProcessCallTreeFromRoots(InstProcessFunction& pfn,
                                                  std::queue<uint32_t>* roots,
                                                  uint32_t stage_idx) {
  bool modified = false;
  std::unordered_set<uint32_t> done;
  // Don't process input and output functions
  for (auto& ifn : param2input_func_id_) done.insert(ifn.second);
  for (auto& ofn : param2output_func_id_) done.insert(ofn.second);
  // Process all functions from roots
  while (!roots->empty()) {
    const uint32_t fi = roots->front();
    roots->pop();
    if (done.insert(fi).second) {
      Function* fn = id2function_.at(fi);
      // Add calls first so we don't add new output function
      context()->AddCalls(fn, roots);
      modified = InstrumentFunction(fn, stage_idx, pfn) || modified;
    }
  }
  return modified;
}